

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.h
# Opt level: O0

void __thiscall
llvm::dwarf::CFIProgram::addInstruction
          (CFIProgram *this,uint8_t Opcode,uint64_t Operand1,uint64_t Operand2)

{
  reference pvVar1;
  Instruction local_78;
  uint64_t local_28;
  uint64_t Operand2_local;
  uint64_t Operand1_local;
  CFIProgram *pCStack_10;
  uint8_t Opcode_local;
  CFIProgram *this_local;
  
  local_28 = Operand2;
  Operand2_local = Operand1;
  Operand1_local._7_1_ = Opcode;
  pCStack_10 = this;
  Instruction::Instruction(&local_78,Opcode);
  std::
  vector<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
  ::push_back(&this->Instructions,&local_78);
  Instruction::~Instruction(&local_78);
  pvVar1 = std::
           vector<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
           ::back(&this->Instructions);
  SmallVectorTemplateBase<unsigned_long,_true>::push_back
            ((SmallVectorTemplateBase<unsigned_long,_true> *)&pvVar1->Ops,&Operand2_local);
  pvVar1 = std::
           vector<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
           ::back(&this->Instructions);
  SmallVectorTemplateBase<unsigned_long,_true>::push_back
            ((SmallVectorTemplateBase<unsigned_long,_true> *)&pvVar1->Ops,&local_28);
  return;
}

Assistant:

void addInstruction(uint8_t Opcode, uint64_t Operand1, uint64_t Operand2) {
    Instructions.push_back(Instruction(Opcode));
    Instructions.back().Ops.push_back(Operand1);
    Instructions.back().Ops.push_back(Operand2);
  }